

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetCFBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  bool bVar1;
  char *pcVar2;
  allocator local_81;
  string local_80;
  char *local_60;
  char *ext;
  string local_48;
  undefined1 local_25;
  BundleDirectoryLevel local_24;
  string *psStack_20;
  BundleDirectoryLevel level_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *fpath;
  
  local_25 = 0;
  local_24 = level;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  GetOutputName(&local_48,this,psStack_20,RuntimeBinaryArtifact);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"BUNDLE_EXTENSION",&local_81);
  pcVar2 = GetProperty(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_60 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    bVar1 = IsXCTestOnApple(this);
    if (bVar1) {
      local_60 = "xctest";
    }
    else {
      local_60 = "bundle";
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_60);
  bVar1 = shouldAddContentLevel(local_24);
  if ((bVar1) && (bVar1 = cmMakefile::PlatformIsAppleIos(this->Makefile), !bVar1)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/Contents");
    bVar1 = shouldAddFullLevel(local_24);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/MacOS");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCFBundleDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath;
  fpath += this->GetOutputName(config, cmStateEnums::RuntimeBinaryArtifact);
  fpath += ".";
  const char* ext = this->GetProperty("BUNDLE_EXTENSION");
  if (!ext) {
    if (this->IsXCTestOnApple()) {
      ext = "xctest";
    } else {
      ext = "bundle";
    }
  }
  fpath += ext;
  if (shouldAddContentLevel(level) && !this->Makefile->PlatformIsAppleIos()) {
    fpath += "/Contents";
    if (shouldAddFullLevel(level)) {
      fpath += "/MacOS";
    }
  }
  return fpath;
}